

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

typed_option<bool> * __thiscall
VW::config::options_i::get_typed_option<bool>(options_i *this,string *key)

{
  size_t sVar1;
  size_t sVar2;
  typed_option<bool> *ptVar3;
  undefined8 *puVar4;
  long local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  (*this->_vptr_options_i[4])(&local_20,this,key);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
  sVar1 = *(size_t *)(local_20 + 0x28);
  sVar2 = typed_option<bool>::type_hash();
  if (sVar1 != sVar2) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = std::__cxx11::string::replace;
    __cxa_throw(puVar4,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
  }
  ptVar3 = (typed_option<bool> *)
           __dynamic_cast(local_20,&config::base_option::typeinfo,&typed_option<bool>::typeinfo,0);
  if (ptVar3 != (typed_option<bool> *)0x0) {
    return ptVar3;
  }
  __cxa_bad_cast();
}

Assistant:

typed_option<T>& get_typed_option(const std::string& key)
  {
    base_option& base = *get_option(key);
    if (base.m_type_hash != typed_option<T>::type_hash())
    {
      throw std::bad_cast();
    }

    return dynamic_cast<typed_option<T>&>(base);
  }